

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O1

void __thiscall Js::StackScriptFunction::BoxState::Box(BoxState *this)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  uint uVar6;
  int iVar7;
  ScriptFunction *pSVar8;
  Type this_00;
  InterpreterStackFrame *pIVar9;
  undefined4 extraout_var;
  JavascriptFunction *pJVar10;
  FrameDisplay *pFVar11;
  FunctionBody *pFVar12;
  Type *pTVar13;
  StackScriptFunction *pSVar14;
  ScriptFunction *pSVar15;
  Type TVar16;
  FunctionInfo *pFVar17;
  void **ppvVar18;
  undefined4 *puVar19;
  IRecyclerVisitedObject IVar20;
  InterpreterStackFrame IVar21;
  Type TVar22;
  char16_t *pcVar23;
  undefined1 local_170 [8];
  JavascriptStackWalker walker;
  FunctionBody *local_b8;
  char16 debugStringBuffer [42];
  JavascriptFunction *caller;
  ScopeSlots local_50;
  ScopeSlots slots;
  
  JavascriptStackWalker::JavascriptStackWalker
            ((JavascriptStackWalker *)local_170,this->scriptContext,true,this->returnAddress,false);
  slots.slotArray.ptr = (Type)__tls_get_addr(&PTR_0155fe48);
  walker.currentFrame.stackCheckCodeHeight = (size_t)&this->functionObjectToBox;
  bVar4 = false;
  while (BVar5 = JavascriptStackWalker::GetCaller
                           ((JavascriptStackWalker *)local_170,
                            (JavascriptFunction **)(debugStringBuffer + 0x28),true), BVar5 != 0) {
    BVar5 = JavascriptFunction::IsScriptFunction(stack0xffffffffffffffa0);
    if (BVar5 != 0) {
      pSVar8 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(stack0xffffffffffffffa0);
      this_00.ptr = (WriteBarrierPtr<void> *)
                    JavascriptFunction::GetFunctionBody((JavascriptFunction *)pSVar8);
      if ((bVar4) ||
         (local_b8 = (FunctionBody *)this_00.ptr,
         bVar3 = JsUtil::
                 BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 ::ContainsKey((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                *)this,&local_b8), bVar3)) {
        pIVar9 = JavascriptStackWalker::GetCurrentInterpreterFrame
                           ((JavascriptStackWalker *)local_170);
        local_b8 = (FunctionBody *)this_00.ptr;
        bVar3 = JsUtil::
                BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                ::ContainsKey((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                               *)this,&local_b8);
        if ((bVar3) || ((bVar4 && ((walker.inlinedFrameCallInfo._0_1_ & 1) == 0)))) {
          if (pIVar9 == (InterpreterStackFrame *)0x0) {
            local_50.slotArray.ptr = (Type)(Type)this_00.ptr;
            if ((walker.inlinedFrameCallInfo._0_1_ & 1) == 0) {
              bVar3 = JsUtil::
                      BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                      ::ContainsKey((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                     *)this,(FunctionBody **)&local_50);
              pcVar23 = L"Native";
              if (bVar4) {
                pcVar23 = L"Native and Inlinee";
              }
              if (!bVar3) {
                pcVar23 = L"Native for Inlinee";
              }
            }
            else {
              bVar3 = JsUtil::
                      BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                      ::ContainsKey((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                     *)this,(FunctionBody **)&local_50);
              pcVar23 = L"Native Inlined (Pending)";
              if (!bVar3) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *(undefined4 *)slots.slotArray.ptr = 1;
                bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                            ,0xb4,"(this->NeedBoxFrame(callerFunctionBody))",
                                            "this->NeedBoxFrame(callerFunctionBody)");
                if (!bVar3) goto LAB_00d5f70b;
                *(undefined4 *)slots.slotArray.ptr = 0;
                pcVar23 = L"Native Inlined (Pending)";
              }
            }
          }
          else {
            if (bVar4) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *(undefined4 *)slots.slotArray.ptr = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                          ,0xae,"(!hasInlineeToBox)","!hasInlineeToBox");
              if (!bVar3) goto LAB_00d5f70b;
              *(undefined4 *)slots.slotArray.ptr = 0;
            }
            bVar3 = JavascriptStackWalker::IsBailedOutFromInlinee
                              ((JavascriptStackWalker *)local_170);
            pcVar23 = L"Interpreted from Inlined Bailout (Pending)";
            if (!bVar3) {
              bVar3 = JavascriptStackWalker::IsBailedOutFromFunction
                                ((JavascriptStackWalker *)local_170);
              pcVar23 = L"Interpreted";
              if (bVar3) {
                pcVar23 = L"Interpreted from Bailout";
              }
            }
          }
          uVar6 = FunctionProxy::GetSourceContextId((FunctionProxy *)this_00.ptr);
          if (((Type *)(this_00.ptr + 2))->ptr == (FunctionInfo *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)slots.slotArray.ptr = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                        ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
            if (!bVar3) goto LAB_00d5f70b;
            *(undefined4 *)slots.slotArray.ptr = 0;
          }
          bVar3 = Phases::IsEnabled((Phases *)&DAT_015d3490,StackFuncPhase,uVar6,
                                    ((Type *)(this_00.ptr + 2))->ptr->functionId);
          if (bVar3) {
            iVar7 = (*(((ParseableFunctionInfo *)&(this_00.ptr)->ptr)->super_FunctionProxy).
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[7])();
            FunctionProxy::GetDebugNumberSet((FunctionProxy *)this_00.ptr,(wchar (*) [42])&local_b8)
            ;
            Output::Print(L"Boxing Frame [%s]: %s %s\n",pcVar23,CONCAT44(extraout_var,iVar7));
            Output::Flush();
          }
        }
        if (pIVar9 == (InterpreterStackFrame *)0x0) {
          if ((walker.inlinedFrameCallInfo._0_1_ & 1) != 0) {
            bVar3 = JavascriptStackWalker::IsCurrentPhysicalFrameForLoopBody
                              ((JavascriptStackWalker *)local_170);
            goto LAB_00d5f19a;
          }
          bVar4 = FunctionBody::DoStackFrameDisplay((FunctionBody *)this_00.ptr);
          if (bVar4) {
            TVar1 = *(Type *)(this_00.ptr + 10);
            ppvVar18 = JavascriptStackWalker::GetCurrentArgv((JavascriptStackWalker *)local_170);
            if ((FrameDisplay *)ppvVar18[(ulong)(TVar1 == 0) - 5] != (FrameDisplay *)0x0) {
              BoxFrameDisplay(this,(FrameDisplay *)ppvVar18[(ulong)(TVar1 == 0) - 5]);
            }
          }
          bVar4 = FunctionBody::DoStackScopeSlots((FunctionBody *)this_00.ptr);
          if (bVar4) {
            TVar1 = *(Type *)(this_00.ptr + 10);
            ppvVar18 = JavascriptStackWalker::GetCurrentArgv((JavascriptStackWalker *)local_170);
            pFVar12 = *(FunctionBody **)
                       ((long)ppvVar18 + ((ulong)(TVar1 == 0) << 3 | 0xffffffffffffffd0));
            if (pFVar12 != (FunctionBody *)0x0) {
              Memory::Recycler::WBSetBit((char *)&local_b8);
              local_b8 = pFVar12;
              Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_b8);
              BoxScopeSlots(this,(Type *)pFVar12,
                            *(uint *)&(local_b8->super_ParseableFunctionInfo).super_FunctionProxy.
                                      super_FinalizableObject.super_IRecyclerVisitedObject.
                                      _vptr_IRecyclerVisitedObject);
            }
          }
          BoxNativeFrame(this,(JavascriptStackWalker *)local_170,(FunctionBody *)this_00.ptr);
          if (((((Type *)(this_00.ptr + 0x15))->ptr != (NestedArray *)0x0) &&
              (((Type *)(this_00.ptr + 0x15))->ptr->nestedCount != 0)) &&
             ((walker.inlinedFrameCallInfo._0_1_ & 1) == 0)) {
            ppvVar18 = JavascriptStackWalker::GetCurrentArgv((JavascriptStackWalker *)local_170);
            IVar20._vptr_IRecyclerVisitedObject =
                 *(_func_int ***)
                  ((long)ppvVar18 +
                  ((ulong)(*(Type *)(this_00.ptr + 10) == 0) << 3 | 0xffffffffffffffe0));
            if (IVar20._vptr_IRecyclerVisitedObject != (_func_int **)0x0) {
              do {
                pSVar14 = VarTo<Js::StackScriptFunction>(IVar20._vptr_IRecyclerVisitedObject);
                UpdateFrameDisplay(this,&pSVar14->super_ScriptFunction);
                IVar20._vptr_IRecyclerVisitedObject =
                     pSVar14[1].super_ScriptFunction.super_ScriptFunctionBase.
                     super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                     super_FinalizableObject.super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject;
                bVar4 = false;
              } while (IVar20._vptr_IRecyclerVisitedObject != (_func_int **)0x0);
              goto LAB_00d5f536;
            }
          }
          bVar4 = false;
        }
        else {
          if (bVar4) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)slots.slotArray.ptr = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                        ,200,"(!hasInlineeToBox)","!hasInlineeToBox");
            if (!bVar3) goto LAB_00d5f70b;
            *(undefined4 *)slots.slotArray.ptr = 0;
          }
          pJVar10 = GetCurrentFunctionObject(*(JavascriptFunction **)(pIVar9 + 0x80));
          if (pJVar10 != stack0xffffffffffffffa0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)slots.slotArray.ptr = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                        ,0xca,
                                        "(StackScriptFunction::GetCurrentFunctionObject(interpreterFrame->GetJavascriptFunction()) == caller)"
                                        ,
                                        "StackScriptFunction::GetCurrentFunctionObject(interpreterFrame->GetJavascriptFunction()) == caller"
                                       );
            if (!bVar3) goto LAB_00d5f70b;
            *(undefined4 *)slots.slotArray.ptr = 0;
          }
          bVar3 = FunctionBody::DoStackFrameDisplay((FunctionBody *)this_00.ptr);
          if (((bVar3) && (((byte)pIVar9[0xd6] & 1) != 0)) &&
             (pFVar11 = InterpreterStackFrame::GetLocalFrameDisplay(pIVar9),
             pFVar11 != (FrameDisplay *)0x0)) {
            pFVar11 = BoxFrameDisplay(this,pFVar11);
            InterpreterStackFrame::SetLocalFrameDisplay(pIVar9,pFVar11);
          }
          bVar3 = FunctionBody::DoStackScopeSlots((FunctionBody *)this_00.ptr);
          if (((bVar3) && (((byte)pIVar9[0xd6] & 1) != 0)) &&
             (pFVar12 = (FunctionBody *)InterpreterStackFrame::GetLocalClosure(pIVar9),
             pFVar12 != (FunctionBody *)0x0)) {
            Memory::Recycler::WBSetBit((char *)&local_b8);
            local_b8 = pFVar12;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_b8);
            pTVar13 = BoxScopeSlots(this,(Type *)pFVar12,
                                    *(uint *)&(local_b8->super_ParseableFunctionInfo).
                                              super_FunctionProxy.super_FinalizableObject.
                                              super_IRecyclerVisitedObject.
                                              _vptr_IRecyclerVisitedObject);
            InterpreterStackFrame::SetLocalClosure(pIVar9,pTVar13);
          }
          if (((Type *)(this_00.ptr + 0x15))->ptr == (NestedArray *)0x0) {
            TVar22 = 0;
          }
          else {
            TVar22 = ((Type *)(this_00.ptr + 0x15))->ptr->nestedCount;
          }
          if (TVar22 != 0) {
            uVar6 = 0;
            do {
              pSVar14 = InterpreterStackFrame::GetStackNestedFunction(pIVar9,uVar6);
              pSVar15 = BoxStackFunction(this,&pSVar14->super_ScriptFunction);
              if (pSVar14->boxedScriptFunction != pSVar15) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *(undefined4 *)slots.slotArray.ptr = 1;
                bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                            ,0xe9,
                                            "(stackFunction->boxedScriptFunction == boxedFunction)",
                                            "stackFunction->boxedScriptFunction == boxedFunction");
                if (!bVar3) goto LAB_00d5f70b;
                *(undefined4 *)slots.slotArray.ptr = 0;
              }
              UpdateFrameDisplay(this,&pSVar14->super_ScriptFunction);
              uVar6 = uVar6 + 1;
            } while (TVar22 != uVar6);
          }
          bVar3 = JavascriptStackWalker::IsBailedOutFromInlinee((JavascriptStackWalker *)local_170);
          if (bVar3) {
            bVar3 = JavascriptStackWalker::IsCurrentPhysicalFrameForLoopBody
                              ((JavascriptStackWalker *)local_170);
LAB_00d5f19a:
            if (bVar3 == false) {
              bVar4 = true;
            }
          }
          else {
            bVar3 = JavascriptStackWalker::IsBailedOutFromFunction
                              ((JavascriptStackWalker *)local_170);
            if (bVar3) {
              BoxNativeFrame(this,(JavascriptStackWalker *)local_170,(FunctionBody *)this_00.ptr);
              if (((((Type *)(this_00.ptr + 0x15))->ptr != (NestedArray *)0x0) &&
                  (((Type *)(this_00.ptr + 0x15))->ptr->nestedCount != 0)) &&
                 ((walker.inlinedFrameCallInfo._0_1_ & 1) == 0)) {
                ppvVar18 = JavascriptStackWalker::GetCurrentArgv((JavascriptStackWalker *)local_170)
                ;
                IVar20._vptr_IRecyclerVisitedObject =
                     *(_func_int ***)
                      ((long)ppvVar18 +
                      ((ulong)(*(Type *)(this_00.ptr + 10) == 0) << 3 | 0xffffffffffffffe0));
                while (IVar20._vptr_IRecyclerVisitedObject != (_func_int **)0x0) {
                  pSVar14 = VarTo<Js::StackScriptFunction>(IVar20._vptr_IRecyclerVisitedObject);
                  UpdateFrameDisplay(this,&pSVar14->super_ScriptFunction);
                  IVar20._vptr_IRecyclerVisitedObject =
                       pSVar14[1].super_ScriptFunction.super_ScriptFunctionBase.
                       super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                       super_FinalizableObject.super_IRecyclerVisitedObject.
                       _vptr_IRecyclerVisitedObject;
                }
              }
            }
          }
        }
      }
      else {
        bVar3 = FunctionBody::DoStackFrameDisplay((FunctionBody *)this_00.ptr);
        if ((bVar3) && ((walker.inlinedFrameCallInfo._0_1_ & 1) == 0)) {
          pIVar9 = JavascriptStackWalker::GetCurrentInterpreterFrame
                             ((JavascriptStackWalker *)local_170);
          if (pIVar9 == (InterpreterStackFrame *)0x0) {
            ppvVar18 = JavascriptStackWalker::GetCurrentArgv((JavascriptStackWalker *)local_170);
            pFVar11 = (FrameDisplay *)ppvVar18[(ulong)(*(Type *)(this_00.ptr + 10) == 0) - 5];
            IVar21 = (InterpreterStackFrame)0x1;
          }
          else {
            pFVar11 = InterpreterStackFrame::GetLocalFrameDisplay(pIVar9);
            IVar21 = pIVar9[0xd6];
          }
          bVar3 = ThreadContext::IsOnStack(pFVar11);
          if (((byte)IVar21 & bVar3) == 1) {
            if (pFVar11->length == 0) {
              uVar6 = 0;
            }
            else {
              uVar6 = 0;
              do {
                TVar16.ptr = (WriteBarrierPtr<void> *)FrameDisplay::GetItem(pFVar11,uVar6);
                if (((FunctionBody *)TVar16.ptr != (FunctionBody *)0x0) &&
                   ((((ParseableFunctionInfo *)&(TVar16.ptr)->ptr)->super_FunctionProxy).
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject < (_func_int **)0x10000)) {
                  Memory::Recycler::WBSetBit((char *)&local_50);
                  local_50.slotArray.ptr = (Type)(Type)TVar16.ptr;
                  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_50);
                  bVar3 = ScopeSlots::IsDebuggerScopeSlotArray(&local_50);
                  if (bVar3) {
LAB_00d5f4ae:
                    iVar7 = 0;
                  }
                  else {
                    pFVar17 = ScopeSlots::GetFunctionInfo(&local_50);
                    pFVar12 = (FunctionBody *)(pFVar17->functionBodyImpl).ptr;
                    bVar3 = FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar12);
                    if (bVar3) {
                      bVar3 = FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar12);
                      if (!bVar3) {
                        AssertCount = AssertCount + 1;
                        Throw::LogAssert();
                        *(undefined4 *)slots.slotArray.ptr = 1;
                        bVar3 = Throw::ReportAssert(
                                                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                                  ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
                        if (!bVar3) goto LAB_00d5f70b;
                        *(undefined4 *)slots.slotArray.ptr = 0;
                      }
                      local_b8 = pFVar12;
                      bVar3 = JsUtil::
                              BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                              ::ContainsKey((BaseDictionary<Js::FunctionBody_*,_Js::FunctionBody_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                             *)this,&local_b8);
                      if (!bVar3) goto LAB_00d5f4a6;
                      iVar7 = 0x11;
                      bVar3 = false;
                    }
                    else {
LAB_00d5f4a6:
                      iVar7 = 0;
                      bVar3 = true;
                    }
                    if (bVar3) goto LAB_00d5f4ae;
                  }
                  if (iVar7 != 0) break;
                }
                uVar6 = uVar6 + 1;
              } while (uVar6 < pFVar11->length);
            }
            for (; uVar6 < pFVar11->length; uVar6 = uVar6 + 1) {
              pFVar12 = (FunctionBody *)FrameDisplay::GetItem(pFVar11,uVar6);
              if ((pFVar12 != (FunctionBody *)0x0) &&
                 ((pFVar12->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject < (_func_int **)0x10000
                 )) {
                Memory::Recycler::WBSetBit((char *)&local_b8);
                local_b8 = pFVar12;
                Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_b8);
                pTVar13 = BoxScopeSlots(this,(Type *)pFVar12,
                                        *(uint *)&(local_b8->super_ParseableFunctionInfo).
                                                  super_FunctionProxy.super_FinalizableObject.
                                                  super_IRecyclerVisitedObject.
                                                  _vptr_IRecyclerVisitedObject);
                FrameDisplay::SetItem(pFVar11,uVar6,pTVar13);
              }
            }
          }
        }
      }
LAB_00d5f536:
      local_b8 = (FunctionBody *)ScriptFunction::GetFunctionProxy(pSVar8);
      bVar3 = JsUtil::
              BaseDictionary<Js::FunctionProxy_*,_Js::FunctionProxy_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::ContainsKey((BaseDictionary<Js::FunctionProxy_*,_Js::FunctionProxy_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                             *)walker.currentFrame.stackCheckCodeHeight,(FunctionProxy **)&local_b8)
      ;
      if ((bVar3) && (bVar3 = ThreadContext::IsOnStack(pSVar8), bVar3)) {
        pSVar14 = VarTo<Js::StackScriptFunction,Js::ScriptFunction>(pSVar8);
        pSVar8 = BoxStackFunction(this,&pSVar14->super_ScriptFunction);
        JavascriptStackWalker::SetCurrentFunction
                  ((JavascriptStackWalker *)local_170,(JavascriptFunction *)pSVar8);
        pIVar9 = JavascriptStackWalker::GetCurrentInterpreterFrame
                           ((JavascriptStackWalker *)local_170);
        if (pIVar9 != (InterpreterStackFrame *)0x0) {
          InterpreterStackFrame::SetExecutingStackFunction(pIVar9,pSVar8);
        }
        if (((((Type *)(this_00.ptr + 0x15))->ptr != (NestedArray *)0x0) &&
            (((Type *)(this_00.ptr + 0x15))->ptr->nestedCount != 0)) &&
           ((*(Type *)(this_00.ptr + 9) & Flags_StackNestedFunc) != Flags_None)) {
          pIVar9 = JavascriptStackWalker::GetCurrentInterpreterFrame
                             ((JavascriptStackWalker *)local_170);
          if (pIVar9 == (InterpreterStackFrame *)0x0) {
            if ((walker.inlinedFrameCallInfo._0_1_ & 1) == 0) {
              ppvVar18 = JavascriptStackWalker::GetCurrentArgv((JavascriptStackWalker *)local_170);
              IVar20._vptr_IRecyclerVisitedObject =
                   *(_func_int ***)
                    ((long)ppvVar18 +
                    ((ulong)(*(Type *)(this_00.ptr + 10) == 0) << 3 | 0xffffffffffffffe0));
              while (IVar20._vptr_IRecyclerVisitedObject != (_func_int **)0x0) {
                pSVar14 = VarTo<Js::StackScriptFunction>(IVar20._vptr_IRecyclerVisitedObject);
                UpdateFrameDisplay(this,&pSVar14->super_ScriptFunction);
                IVar20._vptr_IRecyclerVisitedObject =
                     pSVar14[1].super_ScriptFunction.super_ScriptFunctionBase.
                     super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
                     super_FinalizableObject.super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject;
              }
            }
          }
          else {
            if (((Type *)(this_00.ptr + 0x15))->ptr == (NestedArray *)0x0) {
              TVar22 = 0;
            }
            else {
              TVar22 = ((Type *)(this_00.ptr + 0x15))->ptr->nestedCount;
            }
            if (TVar22 != 0) {
              uVar6 = 0;
              do {
                pSVar14 = InterpreterStackFrame::GetStackNestedFunction(pIVar9,uVar6);
                UpdateFrameDisplay(this,&pSVar14->super_ScriptFunction);
                uVar6 = uVar6 + 1;
              } while (TVar22 != uVar6);
            }
          }
        }
      }
    }
  }
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar19 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                ,400,"(!hasInlineeToBox)","!hasInlineeToBox");
    if (!bVar4) {
LAB_00d5f70b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar19 = 0;
  }
  Finish(this);
  JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_170);
  return;
}

Assistant:

void StackScriptFunction::BoxState::Box()
    {
        JavascriptStackWalker walker(scriptContext, true, returnAddress);
        JavascriptFunction * caller;
        bool hasInlineeToBox = false;
        while (walker.GetCaller(&caller))
        {
            if (!caller->IsScriptFunction())
            {
                continue;
            }

            ScriptFunction * callerScriptFunction = VarTo<ScriptFunction>(caller);
            FunctionBody * callerFunctionBody = callerScriptFunction->GetFunctionBody();
            if (hasInlineeToBox || this->NeedBoxFrame(callerFunctionBody))
            {
                // Box the frame display, but don't need to box the function unless we see them
                // in the slots.

                // If the frame display has any stack nested function, then it must have given to one of the
                // stack functions.  If it doesn't appear in  on eof the stack function , the frame display
                // doesn't contain any stack function
                InterpreterStackFrame * interpreterFrame = walker.GetCurrentInterpreterFrame();

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
                if (this->NeedBoxFrame(callerFunctionBody) || (hasInlineeToBox && !walker.IsInlineFrame()))
                {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    char16 const * frameKind;
                    if (interpreterFrame)
                    {
                        Assert(!hasInlineeToBox);
                        frameKind = walker.IsBailedOutFromInlinee()? _u("Interpreted from Inlined Bailout (Pending)") :
                            walker.IsBailedOutFromFunction()? _u("Interpreted from Bailout") : _u("Interpreted");
                    }
                    else if (walker.IsInlineFrame())
                    {
                        Assert(this->NeedBoxFrame(callerFunctionBody));
                        frameKind = _u("Native Inlined (Pending)");
                    }
                    else if (this->NeedBoxFrame(callerFunctionBody))
                    {
                        frameKind = (hasInlineeToBox? _u("Native and Inlinee") : _u("Native"));
                    }
                    else
                    {
                        frameKind = _u("Native for Inlinee");
                    }

                    PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, callerFunctionBody,
                        _u("Boxing Frame [%s]: %s %s\n"), frameKind,
                        callerFunctionBody->GetDisplayName(), callerFunctionBody->GetDebugNumberSet(debugStringBuffer));
                }
#endif

                if (interpreterFrame)
                {
                    Assert(!hasInlineeToBox);

                    Assert(StackScriptFunction::GetCurrentFunctionObject(interpreterFrame->GetJavascriptFunction()) == caller);

                    if (callerFunctionBody->DoStackFrameDisplay() && interpreterFrame->IsClosureInitDone())
                    {
                        Js::FrameDisplay *stackFrameDisplay = interpreterFrame->GetLocalFrameDisplay();
                        // Local frame display may be null if bailout didn't restore it, which means we don't need it.
                        if (stackFrameDisplay)
                        {
                            Js::FrameDisplay *boxedFrameDisplay = this->BoxFrameDisplay(stackFrameDisplay);
                            interpreterFrame->SetLocalFrameDisplay(boxedFrameDisplay);
                        }
                    }
                    if (callerFunctionBody->DoStackScopeSlots() && interpreterFrame->IsClosureInitDone())
                    {
                        Field(Var)* stackScopeSlots = (Field(Var)*)interpreterFrame->GetLocalClosure();
                        if (stackScopeSlots)
                        {
                            // Scope slot pointer may be null if bailout didn't restore it, which means we don't need it.
                            Field(Var)* boxedScopeSlots = this->BoxScopeSlots(stackScopeSlots, static_cast<uint>(ScopeSlots(stackScopeSlots).GetCount()));
                            interpreterFrame->SetLocalClosure(boxedScopeSlots);
                        }
                    }

                    uint nestedCount = callerFunctionBody->GetNestedCount();
                    for (uint i = 0; i < nestedCount; i++)
                    {
                        // Box the stack function, even if they might not be "created" in the byte code yet.
                        // Some of them will not be captured in slots, so we just need to box them and record it with the
                        // stack func so that when we can just use the boxed value when we need it.
                        StackScriptFunction * stackFunction = interpreterFrame->GetStackNestedFunction(i);
                        ScriptFunction * boxedFunction = this->BoxStackFunction(stackFunction);
                        Assert(stackFunction->boxedScriptFunction == boxedFunction);
                        this->UpdateFrameDisplay(stackFunction);
                    }

                    if (walker.IsBailedOutFromInlinee())
                    {
                        if (!walker.IsCurrentPhysicalFrameForLoopBody())
                        {
                            // this is the interpret frame from bailing out of inline frame
                            // Just mark we have inlinee to box so we will walk the native frame's list when we get there.
                            hasInlineeToBox = true;
                        }
                    }
                    else if (walker.IsBailedOutFromFunction())
                    {
                        // The current interpret frame is from bailing out of a native frame.
                        // Walk native frame that was bailed out as well.
                        // The stack walker is pointing to the native frame already.
                        this->BoxNativeFrame(walker, callerFunctionBody);

                        // We don't need to box this frame, but we may still need to box the scope slot references
                        // within nested frame displays if the slots they refer to have been boxed.
                        if (callerFunctionBody->GetNestedCount() != 0)
                        {
                            this->ForEachStackNestedFunctionNative(walker, callerFunctionBody, [&](ScriptFunction *nestedFunc)
                            {
                                this->UpdateFrameDisplay(nestedFunc);
                            });
                        }
                    }
                }
                else
                {
                    if (walker.IsInlineFrame())
                    {
                        if (!walker.IsCurrentPhysicalFrameForLoopBody())
                        {
                            // We may have function that are not in slots.  So we have to walk the stack function list of the inliner
                            // to box all the needed function to catch those
                            hasInlineeToBox = true;
                        }
                    }
                    else
                    {
                        hasInlineeToBox = false;

                        if (callerFunctionBody->DoStackFrameDisplay())
                        {
                            Js::FrameDisplay *stackFrameDisplay =
                                this->GetFrameDisplayFromNativeFrame(walker, callerFunctionBody);
                            // Local frame display may be null if bailout didn't restore it, which means we don't need it.
                            if (stackFrameDisplay)
                            {
                                this->BoxFrameDisplay(stackFrameDisplay);
                            }
                        }
                        if (callerFunctionBody->DoStackScopeSlots())
                        {
                            Field(Var)* stackScopeSlots = (Field(Var)*)this->GetScopeSlotsFromNativeFrame(walker, callerFunctionBody);
                            if (stackScopeSlots)
                            {
                                // Scope slot pointer may be null if bailout didn't restore it, which means we don't need it.
                                this->BoxScopeSlots(stackScopeSlots, static_cast<uint>(ScopeSlots(stackScopeSlots).GetCount()));
                            }
                        }

                        // walk native frame
                        this->BoxNativeFrame(walker, callerFunctionBody);

                        // We don't need to box this frame, but we may still need to box the scope slot references
                        // within nested frame displays if the slots they refer to have been boxed.
                        if (callerFunctionBody->GetNestedCount() != 0)
                        {
                            this->ForEachStackNestedFunctionNative(walker, callerFunctionBody, [&](ScriptFunction *nestedFunc)
                            {
                                this->UpdateFrameDisplay(nestedFunc);
                            });
                        }
                    }
                }
            }
            else if (callerFunctionBody->DoStackFrameDisplay() && !walker.IsInlineFrame())
            {
                // The case here is that a frame need not be boxed, but the closure environment in that frame
                // refers to an outer boxed frame.
                // Find the FD and walk it looking for a slot array that refers to a FB that must be boxed.
                // Everything from that point outward must be boxed.
                FrameDisplay *frameDisplay;
                InterpreterStackFrame *interpreterFrame = walker.GetCurrentInterpreterFrame();
                bool closureInitDone = true; // Set to true as for native frame bailout will always restore the frameDisplay but for interpreter frame if PROBE_STACK fails closureInitDone won't have completed.

                if (interpreterFrame)
                {
                    frameDisplay = interpreterFrame->GetLocalFrameDisplay();
                    closureInitDone = interpreterFrame->IsClosureInitDone();
                }
                else
                {
                    frameDisplay = (Js::FrameDisplay*)walker.GetCurrentArgv()[
#if _M_IX86 || _M_AMD64
                        callerFunctionBody->GetInParamsCount() == 0 ?
                        JavascriptFunctionArgIndex_StackFrameDisplayNoArg :
#endif
                        JavascriptFunctionArgIndex_StackFrameDisplay];
                }
                if (ThreadContext::IsOnStack(frameDisplay) && closureInitDone)
                {
                    int i;
                    for (i = 0; i < frameDisplay->GetLength(); i++)
                    {
                        Field(Var) *slotArray = (Field(Var)*)frameDisplay->GetItem(i);

                        if (ScopeSlots::Is(slotArray))
                        {
                            ScopeSlots slots(slotArray);
                            if (!slots.IsDebuggerScopeSlotArray())
                            {
                                FunctionProxy *functionProxy = slots.GetFunctionInfo()->GetFunctionProxy();
                                if (functionProxy->IsFunctionBody() && this->NeedBoxFrame(functionProxy->GetFunctionBody()))
                                {
                                    break;
                                }
                            }
                        }
                    }
                    for (; i < frameDisplay->GetLength(); i++)
                    {
                        Field(Var) *pScope = (Field(Var)*)frameDisplay->GetItem(i);
                        if (ScopeSlots::Is(pScope))
                        {
                            Field(Var) *boxedSlots = this->BoxScopeSlots(pScope, static_cast<uint>(ScopeSlots(pScope).GetCount()));
                            frameDisplay->SetItem(i, boxedSlots);
                        }
                    }
                }
            }

            ScriptFunction * boxedCaller = nullptr;
            if (this->NeedBoxScriptFunction(callerScriptFunction))
            {
                // TODO-STACK-NESTED-FUNC: Can't assert this yet, JIT might not do stack func allocation
                // if the function hasn't been parsed or deserialized yet.
                // Assert(ThreadContext::IsOnStack(callerScriptFunction));
                if (ThreadContext::IsOnStack(callerScriptFunction))
                {
                    boxedCaller = this->BoxStackFunction(VarTo<StackScriptFunction>(callerScriptFunction));
                    walker.SetCurrentFunction(boxedCaller);

                    InterpreterStackFrame * interpreterFrame = walker.GetCurrentInterpreterFrame();
                    if (interpreterFrame)
                    {
                        interpreterFrame->SetExecutingStackFunction(boxedCaller);
                    }

                    // We don't need to box this frame, but we may still need to box the scope slot references
                    // within nested frame displays if the slots they refer to have been boxed.
                    if (callerFunctionBody->GetNestedCount() != 0)
                    {
                        this->ForEachStackNestedFunction(walker, callerFunctionBody, [&](ScriptFunction *nestedFunc)
                        {
                            this->UpdateFrameDisplay(nestedFunc);
                        });
                    }
                }
            }
        }

        Assert(!hasInlineeToBox);

        // We have to find one nested function
        this->Finish();
    }